

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

void Tas_ManStop(Tas_Man_t *p)

{
  Tas_Man_t *p_local;
  
  Vec_IntFree(p->vActiveVars);
  Vec_IntFree(p->vWatchLits);
  Vec_IntFree(p->vLevReas);
  Vec_IntFree(p->vModel);
  Vec_PtrFree(p->vTemp);
  if (p->pActivity != (float *)0x0) {
    free(p->pActivity);
    p->pActivity = (float *)0x0;
  }
  if (p->pWatches != (int *)0x0) {
    free(p->pWatches);
    p->pWatches = (int *)0x0;
  }
  if ((p->pStore).pData != (int *)0x0) {
    free((p->pStore).pData);
    (p->pStore).pData = (int *)0x0;
  }
  if ((p->pClauses).pData != (Gia_Obj_t **)0x0) {
    free((p->pClauses).pData);
    (p->pClauses).pData = (Gia_Obj_t **)0x0;
  }
  if ((p->pProp).pData != (Gia_Obj_t **)0x0) {
    free((p->pProp).pData);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  if ((p->pJust).pData != (Gia_Obj_t **)0x0) {
    free((p->pJust).pData);
    (p->pJust).pData = (Gia_Obj_t **)0x0;
  }
  if (p != (Tas_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Tas_ManStop( Tas_Man_t * p )
{
    Vec_IntFree( p->vActiveVars );
    Vec_IntFree( p->vWatchLits );
    Vec_IntFree( p->vLevReas );
    Vec_IntFree( p->vModel );
    Vec_PtrFree( p->vTemp );
    ABC_FREE( p->pActivity );
    ABC_FREE( p->pWatches );
    ABC_FREE( p->pStore.pData );
    ABC_FREE( p->pClauses.pData );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}